

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_handle.cpp
# Opt level: O0

torrent_handle __thiscall
libtorrent::session_handle::add_torrent(session_handle *this,add_torrent_params *params)

{
  bool bVar1;
  long in_RDX;
  __weak_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  torrent_handle tVar2;
  reference_wrapper<boost::system::error_code> ecr;
  error_code ec;
  add_torrent_params *params_local;
  session_handle *this_local;
  torrent_handle *r;
  
  bVar1 = info_hash_t::has_v1((info_hash_t *)(in_RDX + 0x124));
  if (((!bVar1) && (bVar1 = info_hash_t::has_v2((info_hash_t *)(in_RDX + 0x124)), !bVar1)) &&
     (bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDX + 8)), !bVar1)) {
    *(undefined8 *)(in_RDX + 0x124) = *(undefined8 *)(in_RDX + 0x110);
    *(undefined8 *)(in_RDX + 300) = *(undefined8 *)(in_RDX + 0x118);
    *(undefined4 *)(in_RDX + 0x134) = *(undefined4 *)(in_RDX + 0x120);
  }
  bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDX + 8));
  if (bVar1) {
    ::std::__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator*((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)(in_RDX + 8));
    ::std::make_shared<libtorrent::torrent_info,libtorrent::torrent_info&>((torrent_info *)&ec.cat_)
    ;
    ::std::shared_ptr<libtorrent::torrent_info>::operator=
              ((shared_ptr<libtorrent::torrent_info> *)(in_RDX + 8),
               (shared_ptr<libtorrent::torrent_info> *)&ec.cat_);
    ::std::shared_ptr<libtorrent::torrent_info>::~shared_ptr
              ((shared_ptr<libtorrent::torrent_info> *)&ec.cat_);
  }
  boost::system::error_code::error_code((error_code *)&ecr);
  ::std::ref<boost::system::error_code>((error_code *)&ecr);
  sync_call_ret<libtorrent::torrent_handle,libtorrent::torrent_handle(libtorrent::aux::session_impl::*)(libtorrent::add_torrent_params&&,boost::system::error_code&),libtorrent::add_torrent_params,std::reference_wrapper<boost::system::error_code>&>
            (this,(offset_in_session_impl_to_subr)params,
             (add_torrent_params *)libtorrent::aux::session_impl::add_torrent,
             (reference_wrapper<boost::system::error_code> *)0x0);
  bVar1 = boost::system::error_code::operator_cast_to_bool((error_code *)&ecr);
  if (!bVar1) {
    tVar2.m_torrent.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = extraout_RDX._M_pi;
    tVar2.m_torrent.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (torrent_handle)
           tVar2.m_torrent.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>;
  }
  libtorrent::aux::throw_ex<boost::system::system_error,boost::system::error_code&>
            ((error_code *)&ecr);
}

Assistant:

torrent_handle session_handle::add_torrent(add_torrent_params&& params)
	{
		TORRENT_ASSERT_PRECOND(!params.save_path.empty());

#if TORRENT_ABI_VERSION < 3
		if (!params.info_hashes.has_v1() && !params.info_hashes.has_v2() && !params.ti)
			params.info_hashes.v1 = params.info_hash;
#endif

		// the internal torrent object keeps and mutates state in the
		// torrent_info object. We can't let that leak back to the client
		if (params.ti)
			params.ti = std::make_shared<torrent_info>(*params.ti);

#if TORRENT_ABI_VERSION == 1
		handle_backwards_compatible_resume_data(params);
#endif
		error_code ec;
		auto ecr = std::ref(ec);
		auto r = sync_call_ret<torrent_handle>(&session_impl::add_torrent, std::move(params), ecr);
		if (ec) aux::throw_ex<system_error>(ec);
		return r;
	}